

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O1

int wire_to_event(Display *dpy,XEvent *host,xEvent *wire)

{
  uint uVar1;
  CARD32 CVar2;
  XExtDisplayInfo *pXVar3;
  unsigned_long uVar4;
  
  pXVar3 = find_display(dpy);
  if ((pXVar3 == (XExtDisplayInfo *)0x0) || (pXVar3->codes == (XExtCodes *)0x0)) {
    XMissingExtension(dpy,"NV-CONTROL");
LAB_00106445:
    return 0;
  }
  uVar1 = (wire->u).u.type & 0x7f;
  switch(uVar1 - pXVar3->codes->first_event) {
  case 0:
    host->type = uVar1;
    uVar4 = _XSetLastRequestRead(dpy,wire);
    (host->xany).serial = uVar4;
    (host->xany).send_event = (uint)((wire->u).u.type >> 7);
    (host->xany).display = dpy;
    (host->xany).window = (ulong)(wire->u).keyButtonPointer.time;
    (host->xfocus).mode = (wire->u).keyButtonPointer.root;
    (host->xfocus).detail = (wire->u).keyButtonPointer.event;
    (host->xexpose).width = (wire->u).keyButtonPointer.child;
    CVar2 = (wire->u).gravity.pad2;
    break;
  case 1:
    host->type = uVar1;
    uVar4 = _XSetLastRequestRead(dpy,wire);
    (host->xany).serial = uVar4;
    (host->xany).send_event = (uint)((wire->u).u.type >> 7);
    (host->xany).display = dpy;
    (host->xany).window = (ulong)(wire->u).keyButtonPointer.time;
    *(uint *)&(host->xkey).root = (uint)(wire->u).expose.x;
    *(uint *)((long)&(host->xkey).root + 4) = (uint)(wire->u).expose.y;
    (host->xexpose).width = (wire->u).keyButtonPointer.event;
    (host->xexpose).height = (wire->u).keyButtonPointer.child;
    goto LAB_00106439;
  case 2:
    host->type = uVar1;
    uVar4 = _XSetLastRequestRead(dpy,wire);
    (host->xany).serial = uVar4;
    (host->xany).send_event = (uint)((wire->u).u.type >> 7);
    (host->xany).display = dpy;
    (host->xany).window = (ulong)(wire->u).keyButtonPointer.time;
    *(uint *)&(host->xkey).root = (uint)(wire->u).expose.x;
    *(uint *)((long)&(host->xkey).root + 4) = (uint)(wire->u).expose.y;
    (host->xexpose).width = (wire->u).keyButtonPointer.event;
    (host->xexpose).height = (wire->u).keyButtonPointer.child;
    *(uint *)((long)&(host->xkey).time + 4) = (uint)*(byte *)((long)&wire->u + 0x18);
LAB_00106439:
    (host->xexpose).count = (wire->u).gravity.pad2;
    return 1;
  case 3:
  case 4:
    host->type = uVar1;
    uVar4 = _XSetLastRequestRead(dpy,wire);
    (host->xany).serial = uVar4;
    (host->xany).send_event = (uint)((wire->u).u.type >> 7);
    (host->xany).display = dpy;
    (host->xany).window = (ulong)(wire->u).keyButtonPointer.time;
    *(uint *)&(host->xkey).root = (uint)(wire->u).expose.x;
    *(uint *)((long)&(host->xkey).root + 4) = (uint)(wire->u).expose.y;
    (host->xexpose).width = (wire->u).keyButtonPointer.event;
    CVar2 = (wire->u).keyButtonPointer.child;
    break;
  default:
    goto LAB_00106445;
  }
  (host->xexpose).height = CVar2;
  return 1;
}

Assistant:

static Bool wire_to_event (Display *dpy, XEvent *host, xEvent *wire)
{
    XExtDisplayInfo *info = find_display (dpy);
    XNVCtrlEvent *re;
    xnvctrlEvent *event;
    XNVCtrlEventTarget *reTarget;
    xnvctrlEventTarget *eventTarget;
    XNVCtrlEventTargetAvailability *reTargetAvailability;
    XNVCtrlStringEventTarget *reTargetString;
    XNVCtrlBinaryEventTarget *reTargetBinary;

    XNVCTRLCheckExtension (dpy, info, False);
    
    switch ((wire->u.u.type & 0x7F) - info->codes->first_event) {
    case ATTRIBUTE_CHANGED_EVENT:
        re = (XNVCtrlEvent *) host;
        event = (xnvctrlEvent *) wire;
        re->attribute_changed.type = event->u.u.type & 0x7F;
        re->attribute_changed.serial =
            _XSetLastRequestRead(dpy, (xGenericReply*) event);
        re->attribute_changed.send_event = ((event->u.u.type & 0x80) != 0);
        re->attribute_changed.display = dpy;
        re->attribute_changed.time = event->u.attribute_changed.time;
        re->attribute_changed.screen = event->u.attribute_changed.screen;
        re->attribute_changed.display_mask =
            event->u.attribute_changed.display_mask;
        re->attribute_changed.attribute = event->u.attribute_changed.attribute;
        re->attribute_changed.value = event->u.attribute_changed.value;
        break;
    case TARGET_ATTRIBUTE_CHANGED_EVENT:
        reTarget = (XNVCtrlEventTarget *) host;
        eventTarget = (xnvctrlEventTarget *) wire;
        reTarget->attribute_changed.type = eventTarget->u.u.type & 0x7F;
        reTarget->attribute_changed.serial =
            _XSetLastRequestRead(dpy, (xGenericReply*) eventTarget);
        reTarget->attribute_changed.send_event =
            ((eventTarget->u.u.type & 0x80) != 0);
        reTarget->attribute_changed.display = dpy;
        reTarget->attribute_changed.time =
            eventTarget->u.attribute_changed.time;
        reTarget->attribute_changed.target_type =
            eventTarget->u.attribute_changed.target_type;
        reTarget->attribute_changed.target_id =
            eventTarget->u.attribute_changed.target_id;
        reTarget->attribute_changed.display_mask =
            eventTarget->u.attribute_changed.display_mask;
        reTarget->attribute_changed.attribute =
            eventTarget->u.attribute_changed.attribute;
        reTarget->attribute_changed.value =
            eventTarget->u.attribute_changed.value;
        break;
    case TARGET_ATTRIBUTE_AVAILABILITY_CHANGED_EVENT:
        reTargetAvailability = (XNVCtrlEventTargetAvailability *) host;
        eventTarget = (xnvctrlEventTarget *) wire;
        reTargetAvailability->attribute_changed.type =
            eventTarget->u.u.type & 0x7F;
        reTargetAvailability->attribute_changed.serial =
            _XSetLastRequestRead(dpy, (xGenericReply*) eventTarget);
        reTargetAvailability->attribute_changed.send_event =
            ((eventTarget->u.u.type & 0x80) != 0);
        reTargetAvailability->attribute_changed.display = dpy;
        reTargetAvailability->attribute_changed.time =
            eventTarget->u.availability_changed.time;
        reTargetAvailability->attribute_changed.target_type =
            eventTarget->u.availability_changed.target_type;
        reTargetAvailability->attribute_changed.target_id =
            eventTarget->u.availability_changed.target_id;
        reTargetAvailability->attribute_changed.display_mask =
            eventTarget->u.availability_changed.display_mask;
        reTargetAvailability->attribute_changed.attribute =
            eventTarget->u.availability_changed.attribute;
        reTargetAvailability->attribute_changed.availability =
            eventTarget->u.availability_changed.availability;
        reTargetAvailability->attribute_changed.value =
            eventTarget->u.availability_changed.value;
        break;
    case TARGET_STRING_ATTRIBUTE_CHANGED_EVENT:
        reTargetString = (XNVCtrlStringEventTarget *) host;
        eventTarget = (xnvctrlEventTarget *) wire;
        reTargetString->attribute_changed.type = eventTarget->u.u.type & 0x7F;
        reTargetString->attribute_changed.serial =
            _XSetLastRequestRead(dpy, (xGenericReply*) eventTarget);
        reTargetString->attribute_changed.send_event =
            ((eventTarget->u.u.type & 0x80) != 0);
        reTargetString->attribute_changed.display = dpy;
        reTargetString->attribute_changed.time =
            eventTarget->u.attribute_changed.time;
        reTargetString->attribute_changed.target_type =
            eventTarget->u.attribute_changed.target_type;
        reTargetString->attribute_changed.target_id =
            eventTarget->u.attribute_changed.target_id;
        reTargetString->attribute_changed.display_mask =
            eventTarget->u.attribute_changed.display_mask;
        reTargetString->attribute_changed.attribute =
            eventTarget->u.attribute_changed.attribute;
        break;
    case TARGET_BINARY_ATTRIBUTE_CHANGED_EVENT:
        reTargetBinary = (XNVCtrlBinaryEventTarget *) host;
        eventTarget = (xnvctrlEventTarget *) wire;
        reTargetBinary->attribute_changed.type = eventTarget->u.u.type & 0x7F;
        reTargetBinary->attribute_changed.serial =
            _XSetLastRequestRead(dpy, (xGenericReply*) eventTarget);
        reTargetBinary->attribute_changed.send_event =
            ((eventTarget->u.u.type & 0x80) != 0);
        reTargetBinary->attribute_changed.display = dpy;
        reTargetBinary->attribute_changed.time =
            eventTarget->u.attribute_changed.time;
        reTargetBinary->attribute_changed.target_type =
            eventTarget->u.attribute_changed.target_type;
        reTargetBinary->attribute_changed.target_id =
            eventTarget->u.attribute_changed.target_id;
        reTargetBinary->attribute_changed.display_mask =
            eventTarget->u.attribute_changed.display_mask;
        reTargetBinary->attribute_changed.attribute =
            eventTarget->u.attribute_changed.attribute;
        break;

    default:
        return False;
    }
    
    return True;
}